

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

void __thiscall llbuild::buildsystem::BuildFile::~BuildFile(BuildFile *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)this->impl;
  if (puVar1 != (undefined8 *)0x0) {
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                  *)(puVar1 + 0x15));
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
                  *)(puVar1 + 0x11));
    if ((long *)puVar1[0xd] != puVar1 + 0xf) {
      operator_delete((long *)puVar1[0xd],puVar1[0xf] + 1);
    }
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                  *)(puVar1 + 9));
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
                  *)(puVar1 + 5));
    if ((long *)*puVar1 != puVar1 + 2) {
      operator_delete((long *)*puVar1,puVar1[2] + 1);
    }
    operator_delete(puVar1,0xd0);
    return;
  }
  return;
}

Assistant:

BuildFile::~BuildFile() {
  delete static_cast<BuildFileImpl*>(impl);
}